

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::dead_code_elimination(Generator *top)

{
  undefined1 local_b0 [8];
  DeadCodeInstanceElimination visitor_1;
  undefined1 local_58 [8];
  DeadCodeVarElimination visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  DeadCodeVarElimination::DeadCodeVarElimination((DeadCodeVarElimination *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  DeadCodeVarElimination::~DeadCodeVarElimination((DeadCodeVarElimination *)local_58);
  DeadCodeInstanceElimination::DeadCodeInstanceElimination((DeadCodeInstanceElimination *)local_b0);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_b0,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  DeadCodeInstanceElimination::~DeadCodeInstanceElimination((DeadCodeInstanceElimination *)local_b0)
  ;
  remove_empty_block((Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  return;
}

Assistant:

void dead_code_elimination(Generator* top) {
    {
        DeadCodeVarElimination visitor;
        visitor.visit_generator_root_p(top);
    }
    {
        DeadCodeInstanceElimination visitor;
        visitor.visit_generator_root_p(top);
    }

    // clean up empty stmt blocks
    remove_empty_block(top);
}